

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall QGraphicsScene::addItem(QGraphicsScene *this,QGraphicsItem *item)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  WindowType WVar4;
  PanelModality PVar5;
  uint uVar6;
  uint uVar7;
  QGraphicsScenePrivate *panel;
  QGraphicsItemPrivate *pQVar8;
  QGraphicsScene *pQVar9;
  qsizetype qVar10;
  QGraphicsWidget *pQVar11;
  QGraphicsWidgetPrivate *pQVar12;
  const_iterator o;
  qsizetype qVar13;
  QGraphicsItem *pQVar14;
  QGraphicsItem *in_RSI;
  QGraphicsScene *in_RDI;
  long in_FS_OFFSET;
  bool autoActivate;
  QGraphicsItem *child;
  add_const_t<QList<QGraphicsItem_*>_> *__range1;
  QGraphicsWidget *myNewPrev;
  QGraphicsWidget *widget;
  int oldSelectedItemSize;
  QGraphicsItem *itemParent;
  QGraphicsScene *targetScene;
  QGraphicsScene *oldScene;
  QGraphicsScenePrivate *d;
  const_iterator __end1;
  const_iterator __begin1;
  const_iterator it;
  anon_class_1_0_00000001 needsMouseTracking;
  QMetaMethod method;
  QVariant newSceneVariant;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 uVar15;
  FocusReason in_stack_fffffffffffffddc;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 uVar16;
  int in_stack_fffffffffffffde4;
  QGraphicsItem *in_stack_fffffffffffffde8;
  QGraphicsScenePrivate *in_stack_fffffffffffffdf0;
  QGraphicsWidget *in_stack_fffffffffffffdf8;
  QGraphicsScenePrivate *in_stack_fffffffffffffe00;
  QGraphicsWidget *in_stack_fffffffffffffe08;
  QGraphicsWidget *pQVar17;
  QGraphicsScenePrivate *in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe18;
  PanelModality previousModality;
  QGraphicsWidget *pQVar18;
  QGraphicsScenePrivate *in_stack_fffffffffffffe20;
  QGraphicsItem *in_stack_fffffffffffffe28;
  QRectF *in_stack_fffffffffffffe30;
  QGraphicsItem *in_stack_fffffffffffffe38;
  QGraphicsScenePrivate *in_stack_fffffffffffffe40;
  const_iterator local_108;
  const_iterator local_100;
  const_iterator local_f8;
  undefined1 local_e9;
  QRectF local_e8;
  undefined1 local_c8 [24];
  char local_b0 [32];
  char local_90 [24];
  QGraphicsItem *in_stack_ffffffffffffff88;
  QVariant local_68;
  QVariant local_48;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  panel = d_func((QGraphicsScene *)0x9cb581);
  if (in_RSI == (QGraphicsItem *)0x0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8,
               in_stack_fffffffffffffde4,
               (char *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    QMessageLogger::warning(local_90,"QGraphicsScene::addItem: cannot add null item");
    goto LAB_009cc300;
  }
  pQVar8 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->(&in_RSI->d_ptr);
  if (pQVar8->scene == in_RDI) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8,
               in_stack_fffffffffffffde4,
               (char *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    QMessageLogger::warning
              (local_b0,"QGraphicsScene::addItem: item has already been added to this scene");
    goto LAB_009cc300;
  }
  pQVar8 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->(&in_RSI->d_ptr);
  if (pQVar8->scene != (QGraphicsScene *)0x0) {
    removeItem((QGraphicsScene *)in_stack_fffffffffffffe10,
               (QGraphicsItem *)in_stack_fffffffffffffe08);
  }
  local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::fromValue<QGraphicsScene_*,_true>((QGraphicsScene **)in_stack_fffffffffffffde8);
  (*in_RSI->_vptr_QGraphicsItem[0x21])(&local_28,in_RSI,0xb,&local_48);
  ::QVariant::~QVariant(&local_48);
  pQVar9 = qvariant_cast<QGraphicsScene*>
                     ((QVariant *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  if (pQVar9 == in_RDI) {
    bVar1 = QList<QGraphicsItem_*>::isEmpty((QList<QGraphicsItem_*> *)0x9cb78c);
    if (bVar1) {
      local_c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      iVar3 = (*(code *)**(undefined8 **)in_RDI)();
      local_c8._0_16_ = QMetaObject::method(iVar3);
      QMetaMethod::invoke<>
                ((QMetaMethod *)in_stack_fffffffffffffdf8,(QObject *)in_stack_fffffffffffffdf0,
                 (ConnectionType)((ulong)in_stack_fffffffffffffde8 >> 0x20));
    }
    QList<QGraphicsItem_*>::append
              ((QList<QGraphicsItem_*> *)0x9cb819,
               (parameter_type)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    pQVar8 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->(&in_RSI->d_ptr);
    *(uint *)&pQVar8->field_0x168 = *(uint *)&pQVar8->field_0x168 & 0xfffffeff | 0x100;
    pQVar8 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->(&in_RSI->d_ptr);
    if (pQVar8->parent != (QGraphicsItem *)0x0) {
      pQVar8 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->(&pQVar8->parent->d_ptr);
      if (pQVar8->scene != in_RDI) {
        QGraphicsItem::setParentItem
                  ((QGraphicsItem *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffe28);
      }
    }
    pQVar8 = QGraphicsItem::d_func((QGraphicsItem *)0x9cb8bf);
    pQVar8->scene = pQVar9;
    (**(code **)(*(long *)panel->index + 0xb0))(panel->index,in_RSI);
    pQVar8 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->(&in_RSI->d_ptr);
    if (pQVar8->parent == (QGraphicsItem *)0x0) {
      QGraphicsScenePrivate::registerTopLevelItem
                (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    }
    QRectF::QRectF(&local_e8);
    uVar15 = 0;
    uVar16 = 0;
    QGraphicsScenePrivate::markDirty
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
               SUB81((ulong)in_stack_fffffffffffffe28 >> 0x38,0),
               SUB81((ulong)in_stack_fffffffffffffe28 >> 0x30,0),
               SUB81((ulong)in_stack_fffffffffffffe28 >> 0x28,0),
               SUB81((ulong)in_stack_fffffffffffffe28 >> 0x20,0),
               SUB81((ulong)in_stack_fffffffffffffe28 >> 0x18,0));
    *(uint *)&panel->field_0xb8 = *(uint *)&panel->field_0xb8 & 0xfffffffd | 2;
    panel->selectionChanging = panel->selectionChanging + 1;
    qVar10 = QSet<QGraphicsItem_*>::size((QSet<QGraphicsItem_*> *)0x9cb9c5);
    local_e9 = 0xaa;
    if ((*(uint *)&panel->field_0xb8 >> 0xc & 1) != 0) {
      QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::data
                (&in_RSI->d_ptr);
      bVar1 = addItem::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)CONCAT44(in_stack_fffffffffffffde4,uVar16),
                         (QGraphicsItemPrivate *)CONCAT44(in_stack_fffffffffffffddc,uVar15));
      if (bVar1) {
        *(uint *)&panel->field_0xb8 = *(uint *)&panel->field_0xb8 & 0xffffefff;
        QGraphicsScenePrivate::enableMouseTrackingOnViews
                  ((QGraphicsScenePrivate *)CONCAT44(in_stack_fffffffffffffde4,uVar16));
      }
    }
    if ((*(uint *)&panel->field_0xb8 >> 0xd & 1) != 0) {
      pQVar8 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->(&in_RSI->d_ptr);
      if (((*(ulong *)&pQVar8->field_0x160 >> 0xf & 1) != 0) &&
         (*(uint *)&panel->field_0xb8 = *(uint *)&panel->field_0xb8 & 0xffffdfff,
         (*(uint *)&panel->field_0xb8 >> 0xc & 1) != 0)) {
        QGraphicsScenePrivate::enableMouseTrackingOnViews
                  ((QGraphicsScenePrivate *)CONCAT44(in_stack_fffffffffffffde4,uVar16));
      }
    }
    if ((*(uint *)&panel->field_0xb8 >> 0x10 & 1) != 0) {
      pQVar8 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->(&in_RSI->d_ptr);
      if ((*(ulong *)&pQVar8->field_0x160 >> 0x3b & 1) != 0) {
        *(uint *)&panel->field_0xb8 = *(uint *)&panel->field_0xb8 & 0xfffeffff;
        QGraphicsScenePrivate::enableTouchEventsOnViews
                  ((QGraphicsScenePrivate *)CONCAT44(in_stack_fffffffffffffde4,uVar16));
      }
    }
    local_f8._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
    QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
              (&in_RSI->d_ptr);
    local_f8._M_node =
         (_Base_ptr)
         QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::constBegin
                   ((QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_> *)
                    CONCAT44(in_stack_fffffffffffffddc,uVar15));
    while( true ) {
      QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
                (&in_RSI->d_ptr);
      local_100._M_node =
           (_Base_ptr)
           QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::constEnd
                     ((QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_> *)
                      CONCAT44(in_stack_fffffffffffffddc,uVar15));
      bVar1 = ::operator!=((const_iterator *)CONCAT44(in_stack_fffffffffffffde4,uVar16),
                           (const_iterator *)CONCAT44(in_stack_fffffffffffffddc,uVar15));
      previousModality = (PanelModality)((ulong)in_stack_fffffffffffffe18 >> 0x20);
      if (!bVar1) break;
      QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::const_iterator::key
                ((const_iterator *)0x9cbbd2);
      QGraphicsScenePrivate::grabGesture
                (in_stack_fffffffffffffe00,(QGraphicsItem *)in_stack_fffffffffffffdf8,
                 (GestureType)((ulong)in_stack_fffffffffffffe28 >> 0x20));
      QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::const_iterator::operator++
                ((const_iterator *)CONCAT44(in_stack_fffffffffffffde4,uVar16));
    }
    bVar1 = QGraphicsItem::isSelected(in_stack_fffffffffffffde8);
    if (bVar1) {
      QSet<QGraphicsItem_*>::operator<<
                ((QSet<QGraphicsItem_*> *)in_stack_fffffffffffffde8,
                 (QGraphicsItem **)CONCAT44(in_stack_fffffffffffffde4,uVar16));
    }
    bVar1 = QGraphicsItem::isWidget((QGraphicsItem *)0x9cbc34);
    if (bVar1) {
      bVar1 = QGraphicsItem::isVisible((QGraphicsItem *)0x9cbc4a);
      if (bVar1) {
        WVar4 = QGraphicsWidget::windowType
                          ((QGraphicsWidget *)CONCAT44(in_stack_fffffffffffffde4,uVar16));
        if (WVar4 == Popup) {
          QGraphicsScenePrivate::addPopup(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        }
      }
    }
    bVar1 = QGraphicsItem::isPanel((QGraphicsItem *)0x9cbce3);
    if (bVar1) {
      bVar1 = QGraphicsItem::isVisible((QGraphicsItem *)0x9cbcf6);
      if (bVar1) {
        PVar5 = QGraphicsItem::panelModality((QGraphicsItem *)0x9cbd09);
        if (PVar5 != NonModal) {
          QGraphicsScenePrivate::enterModal
                    (in_stack_fffffffffffffe20,(QGraphicsItem *)panel,previousModality);
        }
      }
    }
    bVar1 = QGraphicsItem::isWidget((QGraphicsItem *)0x9cbd32);
    if (bVar1) {
      if (in_RSI == (QGraphicsItem *)0x0) {
        pQVar18 = (QGraphicsWidget *)0x0;
      }
      else {
        pQVar18 = (QGraphicsWidget *)(in_RSI + -1);
      }
      if (panel->tabFocusFirst == (QGraphicsWidget *)0x0) {
        panel->tabFocusFirst = pQVar18;
      }
      else {
        pQVar11 = QGraphicsItem::parentWidget((QGraphicsItem *)in_stack_fffffffffffffe00);
        if (pQVar11 == (QGraphicsWidget *)0x0) {
          bVar1 = QGraphicsItem::isPanel((QGraphicsItem *)0x9cbdce);
          if (!bVar1) {
            pQVar12 = QGraphicsWidget::d_func((QGraphicsWidget *)0x9cbdea);
            pQVar11 = pQVar12->focusPrev;
            pQVar12 = QGraphicsWidget::d_func((QGraphicsWidget *)0x9cbe13);
            pQVar12->focusNext = pQVar18;
            in_stack_fffffffffffffe00 = (QGraphicsScenePrivate *)panel->tabFocusFirst;
            QGraphicsWidget::d_func((QGraphicsWidget *)0x9cbe40);
            pQVar12 = QGraphicsWidget::d_func((QGraphicsWidget *)0x9cbe4c);
            pQVar12->focusNext = (QGraphicsWidget *)in_stack_fffffffffffffe00;
            pQVar12 = QGraphicsWidget::d_func((QGraphicsWidget *)0x9cbe65);
            pQVar17 = pQVar12->focusPrev;
            pQVar12 = QGraphicsWidget::d_func((QGraphicsWidget *)0x9cbe85);
            pQVar12->focusPrev = pQVar17;
            pQVar12 = QGraphicsWidget::d_func((QGraphicsWidget *)0x9cbeab);
            pQVar12->focusPrev = pQVar11;
            in_stack_fffffffffffffdf8 = pQVar18;
          }
        }
      }
    }
    QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
              (&in_RSI->d_ptr);
    QGraphicsItemPrivate::ensureSortedChildren((QGraphicsItemPrivate *)in_stack_fffffffffffffe00);
    QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
              (&in_RSI->d_ptr);
    local_108.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
    local_108 = QList<QGraphicsItem_*>::begin
                          ((QList<QGraphicsItem_*> *)CONCAT44(in_stack_fffffffffffffde4,uVar16));
    o = QList<QGraphicsItem_*>::end
                  ((QList<QGraphicsItem_*> *)CONCAT44(in_stack_fffffffffffffde4,uVar16));
    while( true ) {
      bVar1 = QList<QGraphicsItem_*>::const_iterator::operator!=(&local_108,o);
      if (!bVar1) break;
      QList<QGraphicsItem_*>::const_iterator::operator*(&local_108);
      addItem((QGraphicsScene *)panel,in_stack_ffffffffffffff88);
      QList<QGraphicsItem_*>::const_iterator::operator++(&local_108);
    }
    pQVar8 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->(&in_RSI->d_ptr);
    uVar6 = QFont::resolveMask(&panel->font);
    (*pQVar8->_vptr_QGraphicsItemPrivate[5])(pQVar8,(ulong)uVar6);
    pQVar8 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->(&in_RSI->d_ptr);
    uVar7 = QPalette::resolveMask();
    (*pQVar8->_vptr_QGraphicsItemPrivate[6])(pQVar8,(ulong)uVar7);
    panel->selectionChanging = panel->selectionChanging + -1;
    if (panel->selectionChanging == 0) {
      qVar13 = QSet<QGraphicsItem_*>::size((QSet<QGraphicsItem_*> *)0x9cc05e);
      if (qVar13 != (int)qVar10) {
        selectionChanged((QGraphicsScene *)0x9cc078);
      }
    }
    (*in_RSI->_vptr_QGraphicsItem[0x21])(&local_68,in_RSI,0x10,&local_28);
    ::QVariant::~QVariant(&local_68);
    bVar1 = true;
    if (panel->childExplicitActivation == 0) {
      pQVar8 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->(&in_RSI->d_ptr);
      if ((*(uint *)&pQVar8->field_0x168 >> 2 & 1) != 0) {
        pQVar8 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->(&in_RSI->d_ptr);
        iVar3 = 2;
        if ((*(uint *)&pQVar8->field_0x168 >> 3 & 1) != 0) {
          iVar3 = 1;
        }
        panel->childExplicitActivation = iVar3;
      }
    }
    if (panel->childExplicitActivation == 0) {
LAB_009cc189:
      pQVar8 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->(&in_RSI->d_ptr);
      if (pQVar8->parent == (QGraphicsItem *)0x0) {
        panel->childExplicitActivation = 0;
      }
    }
    else {
      bVar2 = QGraphicsItem::isPanel((QGraphicsItem *)0x9cc13f);
      if (!bVar2) goto LAB_009cc189;
      bVar1 = panel->childExplicitActivation == 1;
      if (bVar1) {
        setActivePanel((QGraphicsScene *)CONCAT44(in_stack_fffffffffffffde4,uVar16),
                       (QGraphicsItem *)CONCAT44(in_stack_fffffffffffffddc,uVar15));
      }
      panel->childExplicitActivation = 0;
    }
    if (((bVar1) && (panel->lastActivePanel == (QGraphicsItem *)0x0)) &&
       (panel->activePanel == (QGraphicsItem *)0x0)) {
      bVar1 = QGraphicsItem::isPanel((QGraphicsItem *)0x9cc1f3);
      if (bVar1) {
        bVar1 = isActive((QGraphicsScene *)CONCAT44(in_stack_fffffffffffffde4,uVar16));
        if (bVar1) {
          setActivePanel((QGraphicsScene *)CONCAT44(in_stack_fffffffffffffde4,uVar16),
                         (QGraphicsItem *)CONCAT44(in_stack_fffffffffffffddc,uVar15));
        }
        else {
          panel->lastActivePanel = in_RSI;
        }
      }
    }
    pQVar8 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->(&in_RSI->d_ptr);
    if ((*(ulong *)&pQVar8->field_0x160 & 0x1000000000000) != 0) {
      QGraphicsScenePrivate::registerScenePosItem
                ((QGraphicsScenePrivate *)CONCAT44(in_stack_fffffffffffffde4,uVar16),
                 (QGraphicsItem *)in_stack_fffffffffffffdf8);
    }
    if ((panel->focusItem == (QGraphicsItem *)0x0) && (in_RSI != panel->lastFocusItem)) {
      pQVar14 = QGraphicsItem::focusItem((QGraphicsItem *)0x9cc2b7);
      if (pQVar14 == in_RSI) {
        QGraphicsItem::focusItem((QGraphicsItem *)0x9cc2ce);
        QGraphicsItem::setFocus
                  ((QGraphicsItem *)CONCAT44(in_stack_fffffffffffffde4,uVar16),
                   in_stack_fffffffffffffddc);
      }
    }
    QGraphicsScenePrivate::updateInputMethodSensitivityInViews
              ((QGraphicsScenePrivate *)CONCAT44(in_stack_fffffffffffffde4,uVar16));
  }
  else if (pQVar9 != (QGraphicsScene *)0x0) {
    pQVar8 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->(&in_RSI->d_ptr);
    if (pQVar8->scene != pQVar9) {
      addItem((QGraphicsScene *)panel,in_stack_ffffffffffffff88);
    }
  }
  ::QVariant::~QVariant((QVariant *)&local_28);
LAB_009cc300:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScene::addItem(QGraphicsItem *item)
{
    Q_D(QGraphicsScene);
    if (!item) {
        qWarning("QGraphicsScene::addItem: cannot add null item");
        return;
    }
    if (item->d_ptr->scene == this) {
        qWarning("QGraphicsScene::addItem: item has already been added to this scene");
        return;
    }
    // Remove this item from its existing scene
    if (QGraphicsScene *oldScene = item->d_ptr->scene)
        oldScene->removeItem(item);

    // Notify the item that its scene is changing, and allow the item to
    // react.
    const QVariant newSceneVariant(item->itemChange(QGraphicsItem::ItemSceneChange,
                                                    QVariant::fromValue<QGraphicsScene *>(this)));
    QGraphicsScene *targetScene = qvariant_cast<QGraphicsScene *>(newSceneVariant);
    if (targetScene != this) {
        if (targetScene && item->d_ptr->scene != targetScene)
            targetScene->addItem(item);
        return;
    }

    if (d->unpolishedItems.isEmpty()) {
        QMetaMethod method = metaObject()->method(d->polishItemsIndex);
        method.invoke(this, Qt::QueuedConnection);
    }
    d->unpolishedItems.append(item);
    item->d_ptr->pendingPolish = true;

    // Detach this item from its parent if the parent's scene is different
    // from this scene.
    if (QGraphicsItem *itemParent = item->d_ptr->parent) {
        if (itemParent->d_ptr->scene != this)
            item->setParentItem(nullptr);
    }

    // Add the item to this scene
    item->d_func()->scene = targetScene;

    // Add the item in the index
    d->index->addItem(item);

    // Add to list of toplevels if this item is a toplevel.
    if (!item->d_ptr->parent)
        d->registerTopLevelItem(item);

    // Add to list of items that require an update. We cannot assume that the
    // item is fully constructed, so calling item->update() can lead to a pure
    // virtual function call to boundingRect().
    d->markDirty(item);
    d->dirtyGrowingItemsBoundingRect = true;

    // Disable selectionChanged() for individual items
    ++d->selectionChanging;
    int oldSelectedItemSize = d->selectedItems.size();

    // Enable mouse tracking if we haven't already done so, and the item needs it.
    // We cannot use itemAcceptsHoverEvents_helper() here, since we need to enable
    // mouse tracking also if this item is temporarily blocked by a modal panel.

    auto needsMouseTracking = [](const QGraphicsItemPrivate *item) {
        return item->acceptsHover
                || (item->isWidget && static_cast<const QGraphicsWidgetPrivate *>(item)->hasDecoration());
    };

    if (d->allItemsIgnoreHoverEvents && needsMouseTracking(item->d_ptr.data())) {
        d->allItemsIgnoreHoverEvents = false;
        d->enableMouseTrackingOnViews();
    }
#ifndef QT_NO_CURSOR
    if (d->allItemsUseDefaultCursor && item->d_ptr->hasCursor) {
        d->allItemsUseDefaultCursor = false;
        if (d->allItemsIgnoreHoverEvents) // already enabled otherwise
            d->enableMouseTrackingOnViews();
    }
#endif //QT_NO_CURSOR

    // Enable touch events if the item accepts touch events.
    if (d->allItemsIgnoreTouchEvents && item->d_ptr->acceptTouchEvents) {
        d->allItemsIgnoreTouchEvents = false;
        d->enableTouchEventsOnViews();
    }

#ifndef QT_NO_GESTURES
    for (auto it = item->d_ptr->gestureContext.constBegin();
              it != item->d_ptr->gestureContext.constEnd(); ++it)
        d->grabGesture(item, it.key());
#endif

    // Update selection lists
    if (item->isSelected())
        d->selectedItems << item;
    if (item->isWidget() && item->isVisible() && static_cast<QGraphicsWidget *>(item)->windowType() == Qt::Popup)
        d->addPopup(static_cast<QGraphicsWidget *>(item));
    if (item->isPanel() && item->isVisible() && item->panelModality() != QGraphicsItem::NonModal)
        d->enterModal(item);

    // Update creation order focus chain. Make sure to leave the widget's
    // internal tab order intact.
    if (item->isWidget()) {
        QGraphicsWidget *widget = static_cast<QGraphicsWidget *>(item);
        if (!d->tabFocusFirst) {
            // No first tab focus widget - make this the first tab focus
            // widget.
            d->tabFocusFirst = widget;
        } else if (!widget->parentWidget() && !widget->isPanel()) {
            // Adding a widget that is not part of a tab focus chain.
            QGraphicsWidget *myNewPrev = d->tabFocusFirst->d_func()->focusPrev;
            myNewPrev->d_func()->focusNext = widget;
            widget->d_func()->focusPrev->d_func()->focusNext = d->tabFocusFirst;
            d->tabFocusFirst->d_func()->focusPrev = widget->d_func()->focusPrev;
            widget->d_func()->focusPrev = myNewPrev;
        }
    }

    // Add all children recursively
    item->d_ptr->ensureSortedChildren();
    for (auto child : std::as_const(item->d_ptr->children))
        addItem(child);

    // Resolve font and palette.
    item->d_ptr->resolveFont(d->font.resolveMask());
    item->d_ptr->resolvePalette(d->palette.resolveMask());


    // Re-enable selectionChanged() for individual items
    --d->selectionChanging;
    if (!d->selectionChanging && d->selectedItems.size() != oldSelectedItemSize)
        emit selectionChanged();

    // Deliver post-change notification
    item->itemChange(QGraphicsItem::ItemSceneHasChanged, newSceneVariant);

    // Update explicit activation
    bool autoActivate = true;
    if (!d->childExplicitActivation && item->d_ptr->explicitActivate)
        d->childExplicitActivation = item->d_ptr->wantsActive ? 1 : 2;
    if (d->childExplicitActivation && item->isPanel()) {
        if (d->childExplicitActivation == 1)
            setActivePanel(item);
        else
            autoActivate = false;
        d->childExplicitActivation = 0;
    } else if (!item->d_ptr->parent) {
        d->childExplicitActivation = 0;
    }

    // Auto-activate this item's panel if nothing else has been activated
    if (autoActivate) {
        if (!d->lastActivePanel && !d->activePanel && item->isPanel()) {
            if (isActive())
                setActivePanel(item);
            else
                d->lastActivePanel = item;
        }
    }

    if (item->d_ptr->flags & QGraphicsItem::ItemSendsScenePositionChanges)
        d->registerScenePosItem(item);

    // Ensure that newly added items that have subfocus set, gain
    // focus automatically if there isn't a focus item already.
    if (!d->focusItem && item != d->lastFocusItem && item->focusItem() == item)
        item->focusItem()->setFocus();

    d->updateInputMethodSensitivityInViews();
}